

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::Search(int iters,int nbytes,char *regexp,SearchImpl *search)

{
  string s;
  string local_58;
  StringPiece local_38;
  
  StopBenchmarkTiming();
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  MakeText(&local_58,nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  local_38.ptr_ = local_58._M_dataplus._M_p;
  local_38.length_ = (int)local_58._M_string_length;
  (*search)(iters,regexp,&local_38,kUnanchored,false);
  SetBenchmarkBytesProcessed((long)nbytes * (long)iters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Search(int iters, int nbytes, const char* regexp, SearchImpl* search) {
  StopBenchmarkTiming();
  string s;
  MakeText(&s, nbytes);
  BenchmarkMemoryUsage();
  StartBenchmarkTiming();
  search(iters, regexp, s, Prog::kUnanchored, false);
  SetBenchmarkBytesProcessed(static_cast<int64>(iters)*nbytes);
}